

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> * __thiscall
Js::SimpleTypeHandler<3ul>::
ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
          (SimpleTypeHandler<3ul> *this,DynamicObject *instance)

{
  Type *pTVar1;
  Recycler *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  PropertyTypes values;
  int iVar5;
  Recycler *alloc;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_01;
  undefined4 *puVar6;
  Var aValue;
  long lVar7;
  ScriptContext *scriptContext;
  SimpleTypeHandler<3ul> *pSVar8;
  undefined1 local_90 [8];
  TrackAllocData data;
  
  pTVar1 = (instance->super_RecyclableObject).type.ptr;
  scriptContext = (((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  this_00 = scriptContext->recycler;
  local_90 = (undefined1  [8])
             &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
              typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_a033ee7;
  data.filename._0_4_ = 0x87;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_90);
  bVar4 = false;
  this_01 = (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *)
            new<Memory::Recycler>(0x30,alloc,0x38bbb2);
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
  SimpleDictionaryTypeHandlerBase
            (this_01,this_00,*(int *)(this + 0xc),*(uint16 *)(this + 0x12),*(uint16 *)(this + 10),
             false,false);
  bVar3 = DynamicTypeHandler::SetSingletonInstanceIfNeeded((DynamicTypeHandler *)this_01,instance);
  if (bVar3) {
    bVar4 = DynamicObject::HasLockedType(instance);
  }
  if (0 < *(int *)(this + 0x18)) {
    pSVar8 = this + 0x20;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    lVar7 = 0;
    data._32_8_ = scriptContext;
    do {
      aValue = DynamicObject::GetSlot(instance,(int)lVar7);
      if ((aValue == (Var)0x0) && (0xf < *(uint *)(*(long *)pSVar8 + 8))) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0x95,
                                    "(value != nullptr || IsInternalPropertyId(descriptors[i].Id->GetPropertyId()))"
                                    ,
                                    "value != nullptr || IsInternalPropertyId(descriptors[i].Id->GetPropertyId())"
                                   );
        if (!bVar3) goto LAB_00e5c0f5;
        *puVar6 = 0;
        scriptContext = (ScriptContext *)data._32_8_;
      }
      if ((bVar4 == false) || (*(uint *)(*(long *)pSVar8 + 8) < 0x10)) {
LAB_00e5bf38:
        bVar3 = false;
      }
      else {
        bVar3 = VarIs<Js::JavascriptFunction>(aValue);
        if (!bVar3) goto LAB_00e5bf38;
        bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixMethodPropsPhase);
        bVar3 = !bVar3;
      }
      SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
      Add<Js::PropertyRecord_const*>
                ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false> *)
                 this_01,*(PropertyRecord **)pSVar8,(PropertyAttributes)pSVar8[8],true,bVar3,false,
                 scriptContext);
      lVar7 = lVar7 + 1;
      pSVar8 = pSVar8 + 0x10;
    } while (lVar7 < *(int *)(this + 0x18));
  }
  DynamicTypeHandler::SetFlags((DynamicTypeHandler *)this_01,(byte)this[9] & 0x22);
  iVar5 = (*(this_01->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x4e])(this_01);
  if (iVar5 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0xa2,"(!newTypeHandler->IsPathTypeHandler())",
                                "!newTypeHandler->IsPathTypeHandler()");
    if (!bVar3) goto LAB_00e5c0f5;
    *puVar6 = 0;
  }
  if (((this_01->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0xa3,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                "newTypeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar3) goto LAB_00e5c0f5;
    *puVar6 = 0;
  }
  values = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)this_01,0xb0,values);
  DynamicTypeHandler::SetInstanceTypeHandler((DynamicTypeHandler *)this_01,instance,true);
  if ((bVar4 != false) && ((instance->super_RecyclableObject).type.ptr == pTVar1)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0xa9,"(!allowFixedFields || instance->GetDynamicType() != oldType)"
                                ,"!allowFixedFields || instance->GetDynamicType() != oldType");
    if (!bVar4) {
LAB_00e5c0f5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  return this_01;
}

Assistant:

T* SimpleTypeHandler<size>::ConvertToTypeHandler(DynamicObject* instance)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

#if ENABLE_FIXED_FIELDS && DBG
        DynamicType* oldType = instance->GetDynamicType();
#endif

        T* newTypeHandler = RecyclerNew(recycler, T, recycler, SimpleTypeHandler<size>::GetSlotCapacity(), GetInlineSlotCapacity(), GetOffsetOfInlineSlots());
#if ENABLE_FIXED_FIELDS
        Assert(HasSingletonInstanceOnlyIfNeeded());

        bool const hasSingletonInstance = newTypeHandler->SetSingletonInstanceIfNeeded(instance);
        // If instance has a shared type, the type handler change below will induce a type transition, which
        // guarantees that any existing fast path field stores (which could quietly overwrite a fixed field
        // on this instance) will be invalidated.  It is safe to mark all fields as fixed.
        bool const allowFixedFields = hasSingletonInstance && instance->HasLockedType();
#endif

        for (int i = 0; i < propertyCount; i++)
        {
            Var value = instance->GetSlot(i);
            Assert(value != nullptr || IsInternalPropertyId(descriptors[i].Id->GetPropertyId()));
#if ENABLE_FIXED_FIELDS
            bool markAsFixed = allowFixedFields && !IsInternalPropertyId(descriptors[i].Id->GetPropertyId()) &&
                (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : false);
#else
            bool markAsFixed = false;
#endif
            newTypeHandler->Add(PointerValue(descriptors[i].Id), descriptors[i].Attributes, true, markAsFixed, false, scriptContext);
        }

        newTypeHandler->SetFlags(IsPrototypeFlag | HasKnownSlot0Flag, this->GetFlags());
        // We don't expect to convert to a PathTypeHandler.  If we change this later we need to review if we want the new type handler to have locked
        // inline slot capacity, or if we want to allow shrinking of the SimpleTypeHandler's inline slot capacity.
        Assert(!newTypeHandler->IsPathTypeHandler());
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);

#if ENABLE_FIXED_FIELDS && DBG
        // If we marked fields as fixed we had better forced a type transition.
        Assert(!allowFixedFields || instance->GetDynamicType() != oldType);
#endif

        return newTypeHandler;
    }